

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-canvas.c
# Opt level: O1

void plutovg_canvas_glyph_metrics
               (plutovg_canvas_t *canvas,plutovg_codepoint_t codepoint,float *advance_width,
               float *left_side_bearing,plutovg_rect_t *extents)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  plutovg_font_face_t *face;
  glyph_t *pgVar4;
  float fVar5;
  
  face = canvas->state->font_face;
  if ((face != (plutovg_font_face_t *)0x0) && (fVar5 = canvas->state->font_size, 0.0 < fVar5)) {
    uVar1 = *(ushort *)((face->info).data + (long)(face->info).head + 0x12);
    fVar5 = fVar5 / (float)(ushort)(uVar1 << 8 | uVar1 >> 8);
    pgVar4 = plutovg_font_face_get_glyph(face,codepoint);
    if (advance_width != (float *)0x0) {
      *advance_width = (float)pgVar4->advance_width * fVar5;
    }
    if (left_side_bearing != (float *)0x0) {
      *left_side_bearing = (float)pgVar4->left_side_bearing * fVar5;
    }
    if (extents != (plutovg_rect_t *)0x0) {
      iVar2 = pgVar4->x1;
      extents->x = (float)iVar2 * fVar5;
      iVar3 = pgVar4->y2;
      extents->y = (float)iVar3 * -fVar5;
      extents->w = (float)(pgVar4->x2 - iVar2) * fVar5;
      extents->h = (float)(pgVar4->y1 - iVar3) * -fVar5;
    }
    return;
  }
  if (advance_width != (float *)0x0) {
    *advance_width = 0.0;
  }
  if (left_side_bearing != (float *)0x0) {
    *left_side_bearing = 0.0;
  }
  if (extents != (plutovg_rect_t *)0x0) {
    extents->x = 0.0;
    extents->y = 0.0;
    extents->w = 0.0;
    extents->h = 0.0;
  }
  return;
}

Assistant:

void plutovg_canvas_glyph_metrics(plutovg_canvas_t* canvas, plutovg_codepoint_t codepoint, float* advance_width, float* left_side_bearing, plutovg_rect_t* extents)
{
    plutovg_state_t* state = canvas->state;
    if(state->font_face && state->font_size > 0.f) {
        plutovg_font_face_get_glyph_metrics(state->font_face, state->font_size, codepoint, advance_width, left_side_bearing, extents);
        return;
    }

    if(advance_width) *advance_width = 0.f;
    if(left_side_bearing) *left_side_bearing = 0.f;
    if(extents) {
        extents->x = 0.f;
        extents->y = 0.f;
        extents->w = 0.f;
        extents->h = 0.f;
    }
}